

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_string_createWithoutSuffix(sysbvm_context_t *context,sysbvm_tuple_t string,char *suffix)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  uint8_t *resultData;
  sysbvm_tuple_t result;
  uint8_t *stringData;
  size_t stringSize;
  size_t suffixLen;
  char *suffix_local;
  sysbvm_tuple_t string_local;
  sysbvm_context_t *context_local;
  
  __n = strlen(suffix);
  context_local = (sysbvm_context_t *)string;
  if ((__n != 0) && (sVar2 = sysbvm_tuple_getSizeInBytes(string), __n <= sVar2)) {
    iVar1 = memcmp((void *)((long)(string + 0x10) + (sVar2 - __n)),suffix,__n);
    if (iVar1 == 0) {
      context_local = (sysbvm_context_t *)sysbvm_string_createEmptyWithSize(context,sVar2 - __n);
      memcpy(&(context_local->heap).shouldAttemptToCollect,(void *)(string + 0x10),sVar2 - __n);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_createWithoutSuffix(sysbvm_context_t *context, sysbvm_tuple_t string, const char *suffix)
{
    size_t suffixLen = strlen(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    if(stringSize < suffixLen)
        return string;

    uint8_t *stringData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    if(memcmp(stringData + stringSize - suffixLen, suffix, suffixLen))
        return string;

    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, stringSize - suffixLen);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, stringData, stringSize - suffixLen);
    return result;
}